

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::Structure_*,_8UL>::pop_back
          (ArrayWithPreallocation<soul::Structure_*,_8UL> *this)

{
  size_t sVar1;
  
  sVar1 = this->numActive;
  if (sVar1 == 1) {
    this->numActive = 0;
    freeIfHeapAllocated(this);
    return;
  }
  if (sVar1 != 0) {
    this->numActive = sVar1 - 1;
    return;
  }
  throwInternalCompilerError("numActive > 0","pop_back",0xdd);
}

Assistant:

void pop_back()
    {
        if (numActive == 1)
        {
            clear();
        }
        else
        {
            SOUL_ASSERT (numActive > 0);
            items[--numActive].~Item();
        }
    }